

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtenvironmentvariables.cpp
# Opt level: O0

QString * qEnvironmentVariable(char *varName)

{
  long lVar1;
  char *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)0x25e2c6);
  qEnvironmentVariable(in_RSI,in_stack_ffffffffffffffc8);
  QString::~QString((QString *)0x25e2e6);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString qEnvironmentVariable(const char *varName)
{
    return qEnvironmentVariable(varName, QString());
}